

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitonicsort.hpp
# Opt level: O3

void mxx::
     bitonic_sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,std::less<int>>
               (int *begin,int *end,comm *param_3)

{
  int *piVar1;
  int iVar2;
  long lVar3;
  unsigned_long uVar4;
  int *piVar5;
  runtime_error *this;
  ulong uVar6;
  int result;
  int i;
  size_t np;
  int local_38;
  uint local_34;
  unsigned_long local_30;
  
  uVar6 = (long)end - (long)begin >> 2;
  local_30 = uVar6;
  uVar4 = right_shift<unsigned_long>(&local_30,param_3);
  local_34 = (uint)(uVar4 == local_30 || param_3->m_rank == 0);
  MPI_Allreduce(&local_34,&local_38,1,&ompi_mpi_int,&ompi_mpi_op_land,param_3->mpi_comm);
  if (local_38 == 0) {
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error
              (this,"bitonic sort only works for the same number of elements on each process.");
    __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if (begin != end) {
    piVar5 = begin + 1;
    do {
      if (piVar5 == end) goto LAB_0013089f;
      iVar2 = *piVar5;
      piVar1 = piVar5 + -1;
      piVar5 = piVar5 + 1;
    } while (*piVar1 <= iVar2);
    lVar3 = 0x3f;
    if (uVar6 != 0) {
      for (; uVar6 >> lVar3 == 0; lVar3 = lVar3 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<std::less<int>>>
              (begin,end,((uint)lVar3 ^ 0x3f) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_comp_iter<std::less<int>>>
              (begin,end);
  }
LAB_0013089f:
  impl::
  bitonic_sort_rec<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,std::less<int>>
            (begin,end,param_3,0,param_3->m_size,0);
  return;
}

Assistant:

void bitonic_sort(_Iterator begin, _Iterator end, _Compare comp, const mxx::comm& comm) {
    size_t np = std::distance(begin, end);
    if (!mxx::all_same(np, comm)) {
        throw std::runtime_error("bitonic sort only works for the same number of elements on each process.");
    }

    if (!std::is_sorted(begin, end, comp)) {
        // sort local elements first
        std::sort(begin, end, comp);
    }

    // recursively sort via bitonic sort
    impl::bitonic_sort_rec(begin, end, comp, comm, 0, comm.size(), impl::asc);
}